

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  Geometry *this;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  byte bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar39;
  bool bVar40;
  long lVar41;
  AABBNodeMB4D *node1;
  ulong uVar42;
  ulong uVar43;
  size_t i;
  long lVar44;
  byte bVar45;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar46;
  byte bVar47;
  uint uVar48;
  size_t sVar49;
  long lVar50;
  bool bVar51;
  ulong uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar70 [64];
  long lStack_2500;
  undefined1 local_24e8 [16];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  }
  pSVar46 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar65._4_4_ = fVar1;
  auVar65._0_4_ = fVar1;
  auVar65._8_4_ = fVar1;
  auVar65._12_4_ = fVar1;
  auVar65._16_4_ = fVar1;
  auVar65._20_4_ = fVar1;
  auVar65._24_4_ = fVar1;
  auVar65._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar66._4_4_ = fVar2;
  auVar66._0_4_ = fVar2;
  auVar66._8_4_ = fVar2;
  auVar66._12_4_ = fVar2;
  auVar66._16_4_ = fVar2;
  auVar66._20_4_ = fVar2;
  auVar66._24_4_ = fVar2;
  auVar66._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar67._4_4_ = fVar3;
  auVar67._0_4_ = fVar3;
  auVar67._8_4_ = fVar3;
  auVar67._12_4_ = fVar3;
  auVar67._16_4_ = fVar3;
  auVar67._20_4_ = fVar3;
  auVar67._24_4_ = fVar3;
  auVar67._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar59._4_4_ = uVar4;
  auVar59._0_4_ = uVar4;
  auVar59._8_4_ = uVar4;
  auVar59._12_4_ = uVar4;
  auVar59._16_4_ = uVar4;
  auVar59._20_4_ = uVar4;
  auVar59._24_4_ = uVar4;
  auVar59._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar61._4_4_ = uVar4;
  auVar61._0_4_ = uVar4;
  auVar61._8_4_ = uVar4;
  auVar61._12_4_ = uVar4;
  auVar61._16_4_ = uVar4;
  auVar61._20_4_ = uVar4;
  auVar61._24_4_ = uVar4;
  auVar61._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar55._4_4_ = uVar4;
  auVar55._0_4_ = uVar4;
  auVar55._8_4_ = uVar4;
  auVar55._12_4_ = uVar4;
  auVar55._16_4_ = uVar4;
  auVar55._20_4_ = uVar4;
  auVar55._24_4_ = uVar4;
  auVar55._28_4_ = uVar4;
  bVar40 = false;
  auVar24 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar68 = ZEXT3264(auVar24);
  auVar69 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar24 = vsubps_avx(auVar65,auVar59);
    fVar13 = auVar59._0_4_;
    fVar14 = auVar59._4_4_;
    fVar15 = auVar59._8_4_;
    fVar16 = auVar59._12_4_;
    fVar17 = auVar59._16_4_;
    fVar18 = auVar59._20_4_;
    fVar19 = auVar59._24_4_;
    auVar20 = vsubps_avx(auVar66,auVar61);
    auVar21 = vsubps_avx(auVar67,auVar55);
    auVar62._0_4_ = fVar3 + auVar55._0_4_;
    auVar62._4_4_ = fVar3 + auVar55._4_4_;
    auVar62._8_4_ = fVar3 + auVar55._8_4_;
    auVar62._12_4_ = fVar3 + auVar55._12_4_;
    auVar62._16_4_ = fVar3 + auVar55._16_4_;
    auVar62._20_4_ = fVar3 + auVar55._20_4_;
    auVar62._24_4_ = fVar3 + auVar55._24_4_;
    auVar62._28_4_ = fVar3 + auVar55._28_4_;
    auVar70._0_4_ = fVar13 * fVar13;
    auVar70._4_4_ = fVar14 * fVar14;
    auVar70._8_4_ = fVar15 * fVar15;
    auVar70._12_4_ = fVar16 * fVar16;
    auVar70._16_4_ = fVar17 * fVar17;
    auVar70._20_4_ = fVar18 * fVar18;
    auVar70._28_36_ = in_ZMM15._28_36_;
    auVar70._24_4_ = fVar19 * fVar19;
LAB_01c675fb:
    do {
      if (pSVar46 == stack) {
        return bVar40;
      }
      pSVar39 = pSVar46 + -1;
      pSVar46 = pSVar46 + -1;
    } while ((float)local_24e8._0_4_ < (float)pSVar39->dist);
    sVar49 = (pSVar46->ptr).ptr;
LAB_01c67618:
    while (uVar48 = (uint)sVar49, context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar49 & 8) != 0) goto LAB_01c67b1d;
      uVar43 = sVar49 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar56._4_4_ = fVar5;
      auVar56._0_4_ = fVar5;
      auVar56._8_4_ = fVar5;
      auVar56._12_4_ = fVar5;
      auVar56._16_4_ = fVar5;
      auVar56._20_4_ = fVar5;
      auVar56._24_4_ = fVar5;
      auVar56._28_4_ = fVar5;
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x100),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0x40));
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x140),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0x80));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x180),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0xc0));
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x120),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0x60));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x160),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0xa0));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar43 + 0x1a0),auVar56,
                                *(undefined1 (*) [32])(uVar43 + 0xe0));
      auVar55 = vmaxps_avx(auVar65,ZEXT1632(auVar33));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar36));
      auVar22 = vsubps_avx(auVar55,auVar65);
      auVar55 = vmaxps_avx(auVar66,ZEXT1632(auVar34));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar37));
      auVar53 = vsubps_avx(auVar55,auVar66);
      auVar55 = vmaxps_avx(auVar67,ZEXT1632(auVar35));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar38));
      auVar55 = vsubps_avx(auVar55,auVar67);
      auVar60._0_4_ =
           auVar55._0_4_ * auVar55._0_4_ +
           auVar53._0_4_ * auVar53._0_4_ + auVar22._0_4_ * auVar22._0_4_;
      auVar60._4_4_ =
           auVar55._4_4_ * auVar55._4_4_ +
           auVar53._4_4_ * auVar53._4_4_ + auVar22._4_4_ * auVar22._4_4_;
      auVar60._8_4_ =
           auVar55._8_4_ * auVar55._8_4_ +
           auVar53._8_4_ * auVar53._8_4_ + auVar22._8_4_ * auVar22._8_4_;
      auVar60._12_4_ =
           auVar55._12_4_ * auVar55._12_4_ +
           auVar53._12_4_ * auVar53._12_4_ + auVar22._12_4_ * auVar22._12_4_;
      auVar60._16_4_ =
           auVar55._16_4_ * auVar55._16_4_ +
           auVar53._16_4_ * auVar53._16_4_ + auVar22._16_4_ * auVar22._16_4_;
      auVar60._20_4_ =
           auVar55._20_4_ * auVar55._20_4_ +
           auVar53._20_4_ * auVar53._20_4_ + auVar22._20_4_ * auVar22._20_4_;
      auVar60._24_4_ =
           auVar55._24_4_ * auVar55._24_4_ +
           auVar53._24_4_ * auVar53._24_4_ + auVar22._24_4_ * auVar22._24_4_;
      auVar60._28_4_ = auVar53._28_4_ + auVar53._28_4_ + auVar22._28_4_;
      uVar31 = vcmpps_avx512vl(ZEXT1632(auVar33),ZEXT1632(auVar36),2);
      uVar30 = vcmpps_avx512vl(ZEXT1632(auVar36),auVar24,1);
      auVar53._4_4_ = fVar1 + fVar14;
      auVar53._0_4_ = fVar1 + fVar13;
      auVar53._8_4_ = fVar1 + fVar15;
      auVar53._12_4_ = fVar1 + fVar16;
      auVar53._16_4_ = fVar1 + fVar17;
      auVar53._20_4_ = fVar1 + fVar18;
      auVar53._24_4_ = fVar1 + fVar19;
      auVar53._28_4_ = fVar1 + auVar59._28_4_;
      uVar25 = vcmpps_avx512vl(ZEXT1632(auVar33),auVar53,6);
      uVar26 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar20,1);
      auVar22._4_4_ = fVar2 + auVar61._4_4_;
      auVar22._0_4_ = fVar2 + auVar61._0_4_;
      auVar22._8_4_ = fVar2 + auVar61._8_4_;
      auVar22._12_4_ = fVar2 + auVar61._12_4_;
      auVar22._16_4_ = fVar2 + auVar61._16_4_;
      auVar22._20_4_ = fVar2 + auVar61._20_4_;
      auVar22._24_4_ = fVar2 + auVar61._24_4_;
      auVar22._28_4_ = fVar2 + auVar61._28_4_;
      uVar27 = vcmpps_avx512vl(ZEXT1632(auVar34),auVar22,6);
      uVar28 = vcmpps_avx512vl(ZEXT1632(auVar38),auVar21,1);
      uVar29 = vcmpps_avx512vl(ZEXT1632(auVar35),auVar62,6);
      bVar45 = ~((byte)uVar27 | (byte)uVar25 | (byte)uVar29 | (byte)uVar30 |
                (byte)uVar26 | (byte)uVar28) & (byte)uVar31;
      uVar52 = (ulong)bVar45;
      if ((uVar48 & 7) == 6) {
        uVar31 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar43 + 0x1e0),1);
        uVar30 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar43 + 0x1c0),0xd);
        uVar52 = (ulong)(bVar45 & (byte)uVar31 & (byte)uVar30);
      }
LAB_01c676f7:
      bVar45 = (byte)uVar52;
      if (bVar45 == 0) goto LAB_01c675fb;
      auVar55 = *(undefined1 (*) [32])(sVar49 & 0xfffffffffffffff0);
      auVar22 = ((undefined1 (*) [32])(sVar49 & 0xfffffffffffffff0))[1];
      auVar53 = vpternlogd_avx512vl(auVar68._0_32_,auVar60,auVar69._0_32_,0xf8);
      auVar54 = vpcompressd_avx512vl(auVar53);
      auVar58._0_4_ = (uint)(bVar45 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar53._0_4_
      ;
      bVar51 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar51 * auVar54._4_4_ | (uint)!bVar51 * auVar53._4_4_;
      bVar51 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar51 * auVar54._8_4_ | (uint)!bVar51 * auVar53._8_4_;
      bVar51 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar51 * auVar54._12_4_ | (uint)!bVar51 * auVar53._12_4_;
      bVar51 = (bool)((byte)(uVar52 >> 4) & 1);
      auVar58._16_4_ = (uint)bVar51 * auVar54._16_4_ | (uint)!bVar51 * auVar53._16_4_;
      bVar51 = (bool)((byte)(uVar52 >> 5) & 1);
      auVar58._20_4_ = (uint)bVar51 * auVar54._20_4_ | (uint)!bVar51 * auVar53._20_4_;
      bVar51 = (bool)((byte)(uVar52 >> 6) & 1);
      auVar58._24_4_ = (uint)bVar51 * auVar54._24_4_ | (uint)!bVar51 * auVar53._24_4_;
      bVar51 = SUB81(uVar52 >> 7,0);
      auVar58._28_4_ = (uint)bVar51 * auVar54._28_4_ | (uint)!bVar51 * auVar53._28_4_;
      auVar53 = vpermt2q_avx512vl(auVar55,auVar58,auVar22);
      sVar49 = auVar53._0_8_;
      bVar45 = bVar45 - 1 & bVar45;
      if (bVar45 != 0) goto LAB_01c678b5;
    }
    if ((sVar49 & 8) == 0) {
      uVar42 = sVar49 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar54._4_4_ = fVar5;
      auVar54._0_4_ = fVar5;
      auVar54._8_4_ = fVar5;
      auVar54._12_4_ = fVar5;
      auVar54._16_4_ = fVar5;
      auVar54._20_4_ = fVar5;
      auVar54._24_4_ = fVar5;
      auVar54._28_4_ = fVar5;
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x100),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0x40));
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x140),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0x80));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x180),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0xc0));
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x120),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0x60));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x160),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0xa0));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x1a0),auVar54,
                                *(undefined1 (*) [32])(uVar42 + 0xe0));
      auVar55 = vmaxps_avx(auVar65,ZEXT1632(auVar33));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar36));
      auVar22 = vsubps_avx(auVar55,auVar65);
      auVar55 = vmaxps_avx(auVar66,ZEXT1632(auVar34));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar37));
      auVar53 = vsubps_avx(auVar55,auVar66);
      auVar55 = vmaxps_avx(auVar67,ZEXT1632(auVar35));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar38));
      auVar55 = vsubps_avx(auVar55,auVar67);
      auVar60._0_4_ =
           auVar22._0_4_ * auVar22._0_4_ + auVar53._0_4_ * auVar53._0_4_ +
           auVar55._0_4_ * auVar55._0_4_;
      auVar60._4_4_ =
           auVar22._4_4_ * auVar22._4_4_ + auVar53._4_4_ * auVar53._4_4_ +
           auVar55._4_4_ * auVar55._4_4_;
      auVar60._8_4_ =
           auVar22._8_4_ * auVar22._8_4_ + auVar53._8_4_ * auVar53._8_4_ +
           auVar55._8_4_ * auVar55._8_4_;
      auVar60._12_4_ =
           auVar22._12_4_ * auVar22._12_4_ + auVar53._12_4_ * auVar53._12_4_ +
           auVar55._12_4_ * auVar55._12_4_;
      auVar60._16_4_ =
           auVar22._16_4_ * auVar22._16_4_ + auVar53._16_4_ * auVar53._16_4_ +
           auVar55._16_4_ * auVar55._16_4_;
      auVar60._20_4_ =
           auVar22._20_4_ * auVar22._20_4_ + auVar53._20_4_ * auVar53._20_4_ +
           auVar55._20_4_ * auVar55._20_4_;
      auVar60._24_4_ =
           auVar22._24_4_ * auVar22._24_4_ + auVar53._24_4_ * auVar53._24_4_ +
           auVar55._24_4_ * auVar55._24_4_;
      auVar60._28_4_ = auVar53._28_4_ + 0.0 + auVar55._28_4_;
      uVar52 = vcmpps_avx512vl(auVar60,auVar70._0_32_,2);
      uVar43 = vcmpps_avx512vl(ZEXT1632(auVar33),ZEXT1632(auVar36),2);
      uVar52 = uVar52 & uVar43;
      if ((uVar48 & 7) == 6) {
        uVar31 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [32])(uVar42 + 0x1c0),0xd);
        uVar30 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [32])(uVar42 + 0x1e0),1);
        uVar52 = (ulong)(byte)((byte)uVar31 & (byte)uVar30 & (byte)uVar52);
      }
      goto LAB_01c676f7;
    }
LAB_01c67b1d:
    lVar41 = (sVar49 & 0xfffffffffffffff0) + 0x40;
    bVar45 = 0;
    lVar50 = 0;
    while (in_ZMM15 = ZEXT3264(auVar70._0_32_), lVar50 != (ulong)(uVar48 & 0xf) - 8) {
      bVar47 = 0;
      for (lVar44 = 0; (lVar44 != 4 && (*(int *)(lVar41 + lVar44 * 4) != -1)); lVar44 = lVar44 + 1)
      {
        uVar7 = *(uint *)(lVar41 + -0x10 + lVar44 * 4);
        this = (context->scene->geometries).items[uVar7].ptr;
        context->geomID = uVar7;
        context->primID = *(uint *)(lVar41 + lVar44 * 4);
        bVar51 = Geometry::pointQuery(this,query,context);
        bVar47 = bVar47 | bVar51;
      }
      bVar45 = bVar45 | bVar47;
      lVar50 = lVar50 + 1;
      lVar41 = lVar41 + 0x50;
      auVar55 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar68 = ZEXT3264(auVar55);
      auVar69 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
    }
    if (bVar45 == 0) goto LAB_01c675fb;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar59._4_4_ = uVar4;
    auVar59._0_4_ = uVar4;
    auVar59._8_4_ = uVar4;
    auVar59._12_4_ = uVar4;
    auVar59._16_4_ = uVar4;
    auVar59._20_4_ = uVar4;
    auVar59._24_4_ = uVar4;
    auVar59._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar61._4_4_ = uVar4;
    auVar61._0_4_ = uVar4;
    auVar61._8_4_ = uVar4;
    auVar61._12_4_ = uVar4;
    auVar61._16_4_ = uVar4;
    auVar61._20_4_ = uVar4;
    auVar61._24_4_ = uVar4;
    auVar61._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar55._4_4_ = uVar4;
    auVar55._0_4_ = uVar4;
    auVar55._8_4_ = uVar4;
    auVar55._12_4_ = uVar4;
    auVar55._16_4_ = uVar4;
    auVar55._20_4_ = uVar4;
    auVar55._24_4_ = uVar4;
    auVar55._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_24e8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      local_24e8 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    }
    bVar40 = true;
  } while( true );
LAB_01c678b5:
  auVar53 = vpshufd_avx2(auVar58,0x55);
  vpermt2q_avx512vl(auVar55,auVar53,auVar22);
  auVar54 = vpminsd_avx2(auVar58,auVar53);
  auVar53 = vpmaxsd_avx2(auVar58,auVar53);
  bVar45 = bVar45 - 1 & bVar45;
  if (bVar45 == 0) {
    auVar54 = vpermi2q_avx512vl(auVar54,auVar55,auVar22);
    sVar49 = auVar54._0_8_;
    auVar55 = vpermt2q_avx512vl(auVar55,auVar53,auVar22);
    (pSVar46->ptr).ptr = auVar55._0_8_;
    lVar41 = 8;
    lStack_2500 = 0x10;
  }
  else {
    auVar63 = vpshufd_avx2(auVar58,0xaa);
    vpermt2q_avx512vl(auVar55,auVar63,auVar22);
    auVar56 = vpminsd_avx2(auVar54,auVar63);
    auVar54 = vpmaxsd_avx2(auVar54,auVar63);
    auVar63 = vpminsd_avx2(auVar53,auVar54);
    auVar54 = vpmaxsd_avx2(auVar53,auVar54);
    bVar45 = bVar45 - 1 & bVar45;
    if (bVar45 == 0) {
      auVar53 = vpermi2q_avx512vl(auVar56,auVar55,auVar22);
      sVar49 = auVar53._0_8_;
      auVar53 = vpermt2q_avx512vl(auVar55,auVar54,auVar22);
      (pSVar46->ptr).ptr = auVar53._0_8_;
      auVar53 = vpermd_avx2(auVar54,auVar60);
      pSVar46->dist = auVar53._0_4_;
      auVar55 = vpermt2q_avx512vl(auVar55,auVar63,auVar22);
      pSVar46[1].ptr.ptr = auVar55._0_8_;
      lStack_2500 = 0x18;
      lVar41 = lStack_2500;
      lStack_2500 = 0x20;
      auVar53 = auVar63;
    }
    else {
      auVar53 = vpshufd_avx2(auVar58,0xff);
      vpermt2q_avx512vl(auVar55,auVar53,auVar22);
      auVar23 = vpminsd_avx2(auVar56,auVar53);
      auVar56 = vpmaxsd_avx2(auVar56,auVar53);
      auVar53 = vpminsd_avx2(auVar63,auVar56);
      auVar56 = vpmaxsd_avx2(auVar63,auVar56);
      auVar63 = vpminsd_avx2(auVar54,auVar56);
      auVar54 = vpmaxsd_avx2(auVar54,auVar56);
      bVar45 = bVar45 - 1 & bVar45;
      if (bVar45 != 0) {
        auVar57 = valignd_avx512vl(auVar58,auVar58,3);
        auVar56 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar58 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar56,auVar23);
        auVar56 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar53 = vpermt2d_avx512vl(auVar58,auVar56,auVar53);
        auVar56 = vpermt2d_avx512vl(auVar53,auVar56,auVar63);
        auVar53 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar53 = vpermt2d_avx512vl(auVar56,auVar53,auVar54);
        auVar64 = ZEXT3264(auVar53);
        bVar47 = bVar45;
        do {
          auVar54 = auVar64._0_32_;
          auVar63._8_4_ = 1;
          auVar63._0_8_ = 0x100000001;
          auVar63._12_4_ = 1;
          auVar63._16_4_ = 1;
          auVar63._20_4_ = 1;
          auVar63._24_4_ = 1;
          auVar63._28_4_ = 1;
          auVar53 = vpermd_avx2(auVar63,auVar57);
          auVar57 = valignd_avx512vl(auVar57,auVar57,1);
          vpermt2q_avx512vl(auVar55,auVar57,auVar22);
          bVar47 = bVar47 - 1 & bVar47;
          uVar31 = vpcmpd_avx512vl(auVar53,auVar54,5);
          auVar53 = vpmaxsd_avx2(auVar53,auVar54);
          bVar32 = (byte)uVar31 << 1;
          auVar54 = valignd_avx512vl(auVar54,auVar54,7);
          bVar51 = (bool)((byte)uVar31 & 1);
          bVar8 = (bool)(bVar32 >> 2 & 1);
          bVar9 = (bool)(bVar32 >> 3 & 1);
          bVar10 = (bool)(bVar32 >> 4 & 1);
          bVar11 = (bool)(bVar32 >> 5 & 1);
          bVar12 = (bool)(bVar32 >> 6 & 1);
          auVar64 = ZEXT3264(CONCAT428((uint)(bVar32 >> 7) * auVar54._28_4_ |
                                       (uint)!(bool)(bVar32 >> 7) * auVar53._28_4_,
                                       CONCAT424((uint)bVar12 * auVar54._24_4_ |
                                                 (uint)!bVar12 * auVar53._24_4_,
                                                 CONCAT420((uint)bVar11 * auVar54._20_4_ |
                                                           (uint)!bVar11 * auVar53._20_4_,
                                                           CONCAT416((uint)bVar10 * auVar54._16_4_ |
                                                                     (uint)!bVar10 * auVar53._16_4_,
                                                                     CONCAT412((uint)bVar9 *
                                                                               auVar54._12_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar53._12_4_,
                                                                               CONCAT48((uint)bVar8
                                                                                        * auVar54.
                                                  _8_4_ | (uint)!bVar8 * auVar53._8_4_,
                                                  CONCAT44((uint)bVar51 * auVar54._4_4_ |
                                                           (uint)!bVar51 * auVar53._4_4_,
                                                           auVar53._0_4_))))))));
        } while (bVar47 != 0);
        lVar41 = (ulong)(uint)POPCOUNT((uint)bVar45) + 3;
        while( true ) {
          auVar54 = auVar64._0_32_;
          auVar53 = vpermt2q_avx512vl(auVar55,auVar54,auVar22);
          sVar49 = auVar53._0_8_;
          bVar51 = lVar41 == 0;
          lVar41 = lVar41 + -1;
          if (bVar51) break;
          (pSVar46->ptr).ptr = sVar49;
          auVar53 = vpermd_avx2(auVar54,auVar60);
          pSVar46->dist = auVar53._0_4_;
          auVar53 = valignd_avx512vl(auVar54,auVar54,1);
          auVar64 = ZEXT3264(auVar53);
          pSVar46 = pSVar46 + 1;
        }
        goto LAB_01c67618;
      }
      auVar56 = vpermi2q_avx512vl(auVar23,auVar55,auVar22);
      sVar49 = auVar56._0_8_;
      auVar56 = vpermt2q_avx512vl(auVar55,auVar54,auVar22);
      (pSVar46->ptr).ptr = auVar56._0_8_;
      auVar54 = vpermd_avx2(auVar54,auVar60);
      pSVar46->dist = auVar54._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar55,auVar63,auVar22);
      pSVar46[1].ptr.ptr = auVar54._0_8_;
      auVar54 = vpermd_avx2(auVar63,auVar60);
      pSVar46[1].dist = auVar54._0_4_;
      auVar55 = vpermt2q_avx512vl(auVar55,auVar53,auVar22);
      pSVar46[2].ptr.ptr = auVar55._0_8_;
      lVar41 = 0x28;
      lStack_2500 = 0x30;
    }
  }
  auVar55 = vpermd_avx2(auVar53,auVar60);
  *(int *)((long)&(pSVar46->ptr).ptr + lVar41) = auVar55._0_4_;
  pSVar46 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar46->ptr).ptr + lStack_2500);
  goto LAB_01c67618;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }